

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_robustness2_features
          (Impl *this,Value *state,VkPhysicalDeviceRobustness2FeaturesEXT **out_features)

{
  uint uVar1;
  VkPhysicalDeviceRobustness2FeaturesEXT *pVVar2;
  Type pGVar3;
  VkPhysicalDeviceRobustness2FeaturesEXT *features;
  VkPhysicalDeviceRobustness2FeaturesEXT **out_features_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPhysicalDeviceRobustness2FeaturesEXT>
                     (&this->allocator);
  *out_features = pVVar2;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"robustBufferAccess2");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->robustBufferAccess2 = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"robustImageAccess2");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->robustImageAccess2 = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"nullDescriptor");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->nullDescriptor = uVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_robustness2_features(const Value &state,
                                                     VkPhysicalDeviceRobustness2FeaturesEXT **out_features)
{
	auto *features = allocator.allocate_cleared<VkPhysicalDeviceRobustness2FeaturesEXT>();
	*out_features = features;

	features->robustBufferAccess2 = state["robustBufferAccess2"].GetUint();
	features->robustImageAccess2 = state["robustImageAccess2"].GetUint();
	features->nullDescriptor = state["nullDescriptor"].GetUint();

	return true;
}